

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm.cpp
# Opt level: O0

int __thiscall ncnn::GroupNorm::forward_inplace(GroupNorm *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  long *in_RSI;
  long in_RDI;
  double dVar2;
  int i_2;
  float *ptr_2;
  float beta;
  float gamma;
  float b;
  float a;
  int q_2;
  float var;
  float tmp;
  int i_1;
  float *ptr_1;
  int q_1;
  float sqsum;
  float mean;
  int i;
  float *ptr;
  int q;
  float sum;
  Mat bottom_top_blob_g;
  int g;
  int channels_per_group;
  int size;
  int h;
  int w;
  Mat *m;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  int local_4f4;
  undefined8 local_4f0;
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined4 local_4d8;
  long *local_4d0;
  undefined4 local_4c8;
  undefined4 local_4c4;
  undefined4 local_4c0;
  undefined4 local_4bc;
  undefined4 local_4b8;
  undefined8 local_4b0;
  void *local_4a8;
  float local_4a0;
  float local_49c;
  float local_498;
  float local_494;
  int local_490;
  float local_48c;
  float local_488;
  int local_484;
  undefined8 local_480;
  undefined8 local_478;
  undefined8 local_470;
  undefined4 local_468;
  long *local_460;
  undefined4 local_458;
  undefined4 local_454;
  undefined4 local_450;
  undefined4 local_44c;
  undefined4 local_448;
  undefined8 local_440;
  void *local_438;
  int local_42c;
  float local_428;
  float local_424;
  int local_420;
  undefined8 local_410;
  undefined8 local_408;
  undefined8 local_400;
  undefined4 local_3f8;
  long *local_3f0;
  undefined4 local_3e8;
  undefined4 local_3e4;
  undefined4 local_3e0;
  undefined4 local_3dc;
  undefined4 local_3d8;
  undefined8 local_3d0;
  void *local_3c8;
  int local_3c0;
  float local_3bc;
  void *local_3b8;
  int *local_3b0;
  ulong local_3a8;
  undefined4 local_3a0;
  long *local_398;
  undefined4 local_390;
  int local_38c;
  int local_388;
  int local_384;
  int local_380;
  ulong local_378;
  int local_36c;
  int local_368;
  int local_364;
  int local_360;
  int local_35c;
  long *local_350;
  undefined8 *local_340;
  undefined8 *local_330;
  undefined8 *local_320;
  void **local_310;
  undefined1 local_2f9;
  int local_2f8;
  int local_2f4;
  void **local_2e8;
  undefined1 local_2d5;
  int local_2d4;
  void **local_2d0;
  undefined8 *local_2c8;
  undefined1 local_2b5;
  int local_2b4;
  void **local_2b0;
  undefined8 *local_2a8;
  undefined1 local_295;
  int local_294;
  void **local_290;
  undefined8 *local_288;
  undefined8 *local_278;
  undefined8 *local_270;
  long local_268;
  long *local_260;
  long local_258;
  long *local_250;
  undefined8 *local_248;
  int local_1f0;
  undefined4 local_1ec;
  void **local_1e8;
  undefined8 *local_1c8;
  undefined8 *local_1a8;
  undefined8 *local_188;
  void *local_150;
  long *local_120;
  undefined4 local_114;
  ulong local_110;
  void *local_108;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  void **local_f0;
  undefined4 local_e4;
  long local_e0;
  long *local_d8;
  undefined4 local_cc;
  ulong local_c8;
  void *local_c0;
  int local_b4;
  int local_b0;
  int local_ac;
  undefined8 *local_a8;
  undefined4 local_9c;
  long local_98;
  long *local_90;
  undefined4 local_84;
  ulong local_80;
  void *local_78;
  int local_6c;
  int local_68;
  int local_64;
  undefined8 *local_60;
  undefined4 local_54;
  long local_50;
  long *local_48;
  undefined4 local_3c;
  ulong local_38;
  void *local_30;
  int local_24;
  int local_20;
  int local_1c;
  undefined8 *local_18;
  undefined4 local_c;
  long local_8;
  
  local_35c = *(int *)((long)in_RSI + 0x2c);
  local_360 = (int)in_RSI[6];
  local_364 = local_35c * local_360;
  local_368 = *(int *)(in_RDI + 0xd4) / *(int *)(in_RDI + 0xd0);
  local_350 = in_RSI;
  for (local_36c = 0; local_36c < *(int *)(in_RDI + 0xd0); local_36c = local_36c + 1) {
    local_2f4 = local_36c * local_368;
    local_2e8 = &local_3b8;
    local_f4 = *(int *)((long)local_350 + 0x2c);
    local_f8 = (int)local_350[6];
    local_fc = *(int *)((long)local_350 + 0x34);
    local_108 = (void *)(*local_350 + local_350[8] * (long)local_2f4 * local_350[2]);
    local_110 = local_350[2];
    local_114 = (undefined4)local_350[3];
    local_120 = (long *)local_350[4];
    local_f0 = &local_3b8;
    local_3b0 = (int *)0x0;
    local_380 = local_368;
    local_e0 = (long)local_f4 * (long)local_f8 * (long)local_fc * local_110;
    local_378 = (local_e0 + 0xfU & 0xfffffffffffffff0) / local_110;
    local_390 = (undefined4)local_350[5];
    local_e4 = 0x10;
    local_100 = local_368;
    local_2f8 = local_368;
    local_2f9 = 1;
    local_3bc = 0.0;
    for (local_3c0 = 0; local_3c0 < local_368; local_3c0 = local_3c0 + 1) {
      local_288 = &local_410;
      local_290 = &local_3b8;
      local_3c8 = (void *)((long)local_108 + local_378 * (long)local_3c0 * local_110);
      local_a8 = &local_410;
      local_98 = (long)local_f4 * (long)local_f8 * local_110;
      local_9c = 0x10;
      local_294 = local_3c0;
      local_295 = 1;
      local_270 = &local_410;
      local_340 = &local_410;
      local_410 = 0;
      local_400 = 0;
      local_3f8 = 0;
      local_3e8 = 0;
      local_3e4 = 0;
      local_3e0 = 0;
      local_3dc = 0;
      local_3d8 = 0;
      local_3d0 = 0;
      local_408 = 0;
      for (local_420 = 0; local_420 < local_364; local_420 = local_420 + 1) {
        local_3bc = *(float *)((long)local_3c8 + (long)local_420 * 4) + local_3bc;
      }
      local_188 = local_340;
      local_d8 = local_120;
      local_cc = local_114;
      local_c8 = local_110;
      local_c0 = local_3c8;
      local_b4 = local_fc;
      local_b0 = local_f8;
      local_ac = local_f4;
      local_3f0 = local_120;
    }
    local_424 = local_3bc / (float)(local_368 * local_364);
    local_428 = 0.0;
    for (local_42c = 0; local_42c < local_368; local_42c = local_42c + 1) {
      local_2a8 = &local_480;
      local_2b0 = &local_3b8;
      local_438 = (void *)((long)local_108 + local_378 * (long)local_42c * local_110);
      local_60 = &local_480;
      local_50 = (long)local_f4 * (long)local_f8 * local_110;
      local_54 = 0x10;
      local_2b4 = local_42c;
      local_2b5 = 1;
      local_278 = &local_480;
      local_330 = &local_480;
      local_480 = 0;
      local_470 = 0;
      local_468 = 0;
      local_458 = 0;
      local_454 = 0;
      local_450 = 0;
      local_44c = 0;
      local_448 = 0;
      local_440 = 0;
      local_478 = 0;
      for (local_484 = 0; local_484 < local_364; local_484 = local_484 + 1) {
        local_488 = *(float *)((long)local_438 + (long)local_484 * 4) - local_424;
        local_428 = local_488 * local_488 + local_428;
      }
      local_1a8 = local_330;
      local_90 = local_120;
      local_84 = local_114;
      local_80 = local_110;
      local_78 = local_438;
      local_6c = local_fc;
      local_68 = local_f8;
      local_64 = local_f4;
      local_460 = local_120;
    }
    local_48c = local_428 / (float)(local_368 * local_364);
    local_3b8 = local_108;
    local_3a8 = local_110;
    local_3a0 = local_114;
    local_398 = local_120;
    local_38c = local_f4;
    local_388 = local_f8;
    local_384 = local_fc;
    for (local_490 = 0; local_490 < local_368; local_490 = local_490 + 1) {
      if (*(int *)(in_RDI + 0xdc) == 0) {
        dVar2 = std::sqrt((double)(ulong)(uint)(local_48c + *(float *)(in_RDI + 0xd8)));
        local_494 = 1.0 / SUB84(dVar2,0);
        local_498 = -local_424 * local_494;
      }
      else {
        local_250 = (long *)(in_RDI + 0xe0);
        local_258 = (long)(local_36c * local_368 + local_490);
        fVar1 = *(float *)(*local_250 + local_258 * 4);
        local_260 = (long *)(in_RDI + 0x128);
        local_268 = (long)(local_36c * local_368 + local_490);
        local_4a0 = *(float *)(*local_260 + local_268 * 4);
        local_49c = fVar1;
        dVar2 = std::sqrt((double)(ulong)(uint)(local_48c + *(float *)(in_RDI + 0xd8)));
        local_494 = fVar1 / SUB84(dVar2,0);
        local_498 = -local_424 * local_494 + local_4a0;
      }
      local_2c8 = &local_4f0;
      local_2d0 = &local_3b8;
      local_4a8 = (void *)((long)local_3b8 + local_378 * (long)local_490 * local_3a8);
      local_18 = &local_4f0;
      local_4d0 = local_398;
      local_8 = (long)local_38c * (long)local_388 * local_3a8;
      local_c = 0x10;
      local_1c = local_38c;
      local_20 = local_388;
      local_24 = local_384;
      local_38 = local_3a8;
      local_3c = local_3a0;
      local_48 = local_398;
      local_2d4 = local_490;
      local_2d5 = 1;
      local_248 = &local_4f0;
      local_320 = &local_4f0;
      local_4f0 = 0;
      local_4e0 = 0;
      local_4d8 = 0;
      local_4c8 = 0;
      local_4c4 = 0;
      local_4c0 = 0;
      local_4bc = 0;
      local_4b8 = 0;
      local_4b0 = 0;
      local_4e8 = 0;
      for (local_4f4 = 0; local_4f4 < local_364; local_4f4 = local_4f4 + 1) {
        *(float *)((long)local_4a8 + (long)local_4f4 * 4) =
             *(float *)((long)local_4a8 + (long)local_4f4 * 4) * local_494 + local_498;
      }
      local_1c8 = local_320;
      local_30 = local_4a8;
    }
    local_310 = &local_3b8;
    local_1e8 = local_310;
    if (local_3b0 != (int *)0x0) {
      local_1ec = 0xffffffff;
      LOCK();
      local_1f0 = *local_3b0;
      *local_3b0 = *local_3b0 + -1;
      UNLOCK();
      if (local_1f0 == 1) {
        if (local_398 == (long *)0x0) {
          local_150 = local_3b8;
          if (local_3b8 != (void *)0x0) {
            free(local_3b8);
          }
        }
        else {
          (**(code **)(*local_398 + 0x18))(local_398,local_3b8);
        }
      }
    }
  }
  return 0;
}

Assistant:

int GroupNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // x = (x - mean) / sqrt(var + eps) * gamma + beta

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int size = w * h;

    int channels_per_group = channels / group;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);

        // mean and var
        float sum = 0.f;
        for (int q = 0; q < channels_per_group; q++)
        {
            const float* ptr = bottom_top_blob_g.channel(q);
            for (int i = 0; i < size; i++)
            {
                sum += ptr[i];
            }
        }
        float mean = sum / (channels_per_group * size);

        float sqsum = 0.f;
        for (int q = 0; q < channels_per_group; q++)
        {
            const float* ptr = bottom_top_blob_g.channel(q);
            for (int i = 0; i < size; i++)
            {
                float tmp = ptr[i] - mean;
                sqsum += tmp * tmp;
            }
        }
        float var = sqsum / (channels_per_group * size);

        for (int q = 0; q < channels_per_group; q++)
        {
            float a;
            float b;
            if (affine)
            {
                float gamma = gamma_data[g * channels_per_group + q];
                float beta = beta_data[g * channels_per_group + q];

                a = static_cast<float>(gamma / sqrt(var + eps));
                b = -mean * a + beta;
            }
            else
            {
                a = static_cast<float>(1.f / (sqrt(var + eps)));
                b = -mean * a;
            }

            float* ptr = bottom_top_blob_g.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] = ptr[i] * a + b;
            }
        }
    }

    return 0;
}